

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t do_helper_tr(CPUS390XState_conflict *env,uint32_t len,uint64_t array,uint64_t trans,
                     uintptr_t ra)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    uVar1 = cpu_ldub_data_ra_s390x(env,uVar3 + array,ra);
    uVar1 = cpu_ldub_data_ra_s390x(env,(uVar1 & 0xff) + trans,ra);
    cpu_stb_data_ra_s390x(env,uVar3 + array,uVar1 & 0xff,ra);
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 <= len);
  return env->cc_op;
}

Assistant:

static uint32_t do_helper_tr(CPUS390XState *env, uint32_t len, uint64_t array,
                             uint64_t trans, uintptr_t ra)
{
    uint32_t i;

    for (i = 0; i <= len; i++) {
        uint8_t byte = cpu_ldub_data_ra(env, array + i, ra);
        uint8_t new_byte = cpu_ldub_data_ra(env, trans + byte, ra);
        cpu_stb_data_ra(env, array + i, new_byte, ra);
    }

    return env->cc_op;
}